

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_parser.c
# Opt level: O2

int d_get_start_state(D_ParserTables *parser_tables_gram,char *name)

{
  uint uVar1;
  D_Symbol *pDVar2;
  int iVar3;
  long lVar4;
  
  uVar1 = parser_tables_gram->nsymbols;
  lVar4 = 0;
  while( true ) {
    if ((ulong)uVar1 * 0x18 - lVar4 == 0) {
      return -1;
    }
    pDVar2 = parser_tables_gram->symbols;
    if ((*(int *)((long)&pDVar2->kind + lVar4) == 1) &&
       (iVar3 = strcmp(*(char **)((long)&pDVar2->name + lVar4),name), iVar3 == 0)) break;
    lVar4 = lVar4 + 0x18;
  }
  return *(int *)((long)&pDVar2->start_symbol + lVar4);
}

Assistant:

int d_get_start_state(D_ParserTables* parser_tables_gram, char *name) {
  int i;
  for (i = 0; i < parser_tables_gram->nsymbols; i++)
    if (parser_tables_gram->symbols[i].kind == D_SYMBOL_NTERM && !strcmp(parser_tables_gram->symbols[i].name, name))
      return parser_tables_gram->symbols[i].start_symbol;
  return -1;
}